

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

int corpus_get_sent(char **trans)

{
  char *__s;
  byte *pbVar1;
  int32 iVar2;
  char *pcVar3;
  size_t sVar4;
  FILE *__stream;
  lineiter_t *li;
  char *pcVar5;
  size_t sVar6;
  ushort **ppuVar7;
  long ln;
  byte *pbVar8;
  uint uVar9;
  char acStack_228 [520];
  
  pcVar5 = transcription_line;
  if (transcription_fp == (FILE *)0x0) {
    mk_filename(0,cur_ctl_path);
    __stream = fopen(mk_filename::fn,"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                     ,0x4ea,"Unable to open %s for reading\n",mk_filename::fn);
    }
    li = lineiter_start_clean((FILE *)__stream);
    if (li == (lineiter_t *)0x0) {
      mk_filename(0,cur_ctl_path);
      pcVar3 = "Unable to read data in sent file %s\n";
      pcVar5 = mk_filename::fn;
      ln = 0x4fc;
LAB_00113ed1:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,ln,pcVar3,pcVar5);
      return -1;
    }
    pcVar5 = strdup(li->buf);
    *trans = pcVar5;
    lineiter_free(li);
    fclose(__stream);
  }
  else {
    pcVar3 = strrchr(transcription_line,0x29);
    if ((pcVar3 != (char *)0x0) &&
       (sVar4 = strspn(pcVar3 + 1," \t\r\n"), pcVar3[(int)sVar4 + 1] == '\0')) {
      *pcVar3 = '\0';
      do {
        __s = pcVar3;
        pcVar3 = __s + -1;
        if (pcVar3 < pcVar5) {
          if (*pcVar3 != '(') {
            pcVar3 = "Expected open paren after ending close paren in line: \'%s\'\n";
            ln = 0x5bd;
            goto LAB_00113ed1;
          }
          break;
        }
      } while (*pcVar3 != '(');
      sVar4 = strlen(__s);
      if (0x1ff < sVar4) {
        __assert_fail("strlen(s+1) < 512",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                      ,0x5a4,"int corpus_read_next_transcription_line(char **)");
      }
      strcpy(acStack_228,__s);
      pcVar5 = corpus_utt();
      iVar2 = strcmp_nocase(acStack_228,pcVar5);
      if (iVar2 != 0) {
        if ((cur_ctl_path == (char *)0x0) || (pcVar5 = cur_ctl_path, *cur_ctl_path == '\0')) {
          pcVar5 = "N/A";
        }
        sVar4 = strlen(pcVar5);
        sVar6 = strlen(acStack_228);
        if (((sVar6 != 0) && (uVar9 = (int)sVar4 - (int)sVar6, (uVar9 & 0x80000000) == 0)) &&
           (iVar2 = strcmp_nocase(pcVar5 + (uVar9 & 0x7fffffff),acStack_228), iVar2 != 0)) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                  ,0x5ae,
                  "Utterance id in transcription file, \'%s\', does not match filename in control path \'%s\'.\n"
                  ,acStack_228,pcVar5);
        }
      }
      pcVar5 = transcription_line;
      pbVar1 = (byte *)(__s + -2);
      do {
        pbVar8 = pbVar1;
        if (pbVar8 < pcVar5) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                  ,0x5b6,"Utterance transcription is empty: %s\n",pcVar5);
          exit(1);
        }
        ppuVar7 = __ctype_b_loc();
        pbVar1 = pbVar8 + -1;
      } while ((*(byte *)((long)*ppuVar7 + (ulong)*pbVar8 * 2 + 1) & 0x20) != 0);
      pbVar8[1] = 0;
    }
    pcVar5 = strdup(pcVar5);
    *trans = pcVar5;
  }
  return 0;
}

Assistant:

int
corpus_get_sent(char **trans)
{
  if (transcription_fp == NULL)
    return corpus_read_next_sent_file(trans);
  else
    return corpus_read_next_transcription_line(trans);
}